

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O2

MATRIX mat_copy(MATRIX A)

{
  MATRIX ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppdVar1 = mat_creat(*(int *)(A + -1),*(int *)((long)A + -4),-1);
  if (ppdVar1 != (MATRIX)0x0) {
    uVar2 = (ulong)*(uint *)(A + -1);
    if ((int)*(uint *)(A + -1) < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      uVar4 = (ulong)*(uint *)((long)A + -4);
      if ((int)*(uint *)((long)A + -4) < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        ppdVar1[uVar3][uVar5] = A[uVar3][uVar5];
      }
    }
  }
  return ppdVar1;
}

Assistant:

MATRIX mat_copy( MATRIX A )
{
	int	i, j;
	MATRIX	C;

	if ((C = mat_creat( MatRow(A), MatCol(A), UNDEFINED )) == NULL)
		return (NULL);

	for (i=0; i<MatRow(A); i++)
	for (j=0; j<MatCol(A); j++)
		{
		C[i][j] = A[i][j];
		}
	return (C);
}